

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::Parser::ParseFlexBufferNumericConstant(Parser *this,Builder *builder)

{
  bool bVar1;
  char *s;
  double in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  double local_28;
  double d;
  Builder *builder_local;
  Parser *this_local;
  
  d = in_RDX;
  builder_local = builder;
  this_local = this;
  s = (char *)std::__cxx11::string::c_str();
  bVar1 = StringToNumber<double>(s,&local_28);
  if (bVar1) {
    flexbuffers::Builder::Double((Builder *)d,local_28);
    anon_unknown_0::NoError();
  }
  else {
    std::operator+(&local_48,"unexpected floating-point constant: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(builder->stack_).
                    super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Error(this,(string *)builder);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseFlexBufferNumericConstant(
    flexbuffers::Builder *builder) {
  double d;
  if (!StringToNumber(attribute_.c_str(), &d))
    return Error("unexpected floating-point constant: " + attribute_);
  builder->Double(d);
  return NoError();
}